

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast.h
# Opt level: O0

void __thiscall
ikfast::IkSolution<double>::GetSolution
          (IkSolution<double> *this,double *solution,double *freevalues)

{
  double dVar1;
  double dVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong local_28;
  size_t i;
  double *freevalues_local;
  double *solution_local;
  IkSolution<double> *this_local;
  
  for (local_28 = 0;
      sVar3 = std::
              vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
              ::size(&this->_vbasesol), local_28 < sVar3; local_28 = local_28 + 1) {
    pvVar4 = std::
             vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
             ::operator[](&this->_vbasesol,local_28);
    if (pvVar4->freeind < '\0') {
      pvVar4 = std::
               vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
               ::operator[](&this->_vbasesol,local_28);
      solution[local_28] = pvVar4->foffset;
    }
    else {
      pvVar4 = std::
               vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
               ::operator[](&this->_vbasesol,local_28);
      dVar1 = freevalues[pvVar4->freeind];
      pvVar4 = std::
               vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
               ::operator[](&this->_vbasesol,local_28);
      dVar2 = pvVar4->fmul;
      pvVar4 = std::
               vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
               ::operator[](&this->_vbasesol,local_28);
      solution[local_28] = dVar1 * dVar2 + pvVar4->foffset;
      if (solution[local_28] <= 3.14159265358979) {
        if (solution[local_28] <= -3.14159265358979 && solution[local_28] != -3.14159265358979) {
          solution[local_28] = solution[local_28] + 6.28318530717959;
        }
      }
      else {
        solution[local_28] = solution[local_28] - 6.28318530717959;
      }
    }
  }
  return;
}

Assistant:

virtual void GetSolution(T* solution, const T* freevalues) const {
        for(std::size_t i = 0; i < _vbasesol.size(); ++i) {
            if( _vbasesol[i].freeind < 0 )
                solution[i] = _vbasesol[i].foffset;
            else {
                solution[i] = freevalues[_vbasesol[i].freeind]*_vbasesol[i].fmul + _vbasesol[i].foffset;
                if( solution[i] > T(3.14159265358979) ) {
                    solution[i] -= T(6.28318530717959);
                }
                else if( solution[i] < T(-3.14159265358979) ) {
                    solution[i] += T(6.28318530717959);
                }
            }
        }
    }